

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

bool __thiscall
ON_HistoryRecord::SetGeometryValue(ON_HistoryRecord *this,int value_id,ON_Geometry *g)

{
  bool bVar1;
  ON_SimpleArray<ON_Geometry_*> local_60;
  undefined1 local_38 [8];
  ON_SimpleArray<ON_Geometry_*> a;
  ON_Geometry *g_local;
  int value_id_local;
  ON_HistoryRecord *this_local;
  
  a._16_8_ = g;
  ON_SimpleArray<ON_Geometry_*>::ON_SimpleArray((ON_SimpleArray<ON_Geometry_*> *)local_38,1);
  ON_SimpleArray<ON_Geometry_*>::Append
            ((ON_SimpleArray<ON_Geometry_*> *)local_38,(ON_Geometry **)&a.m_count);
  ON_SimpleArray<ON_Geometry_*>::ON_SimpleArray(&local_60,(ON_SimpleArray<ON_Geometry_*> *)local_38)
  ;
  bVar1 = SetGeometryValues(this,value_id,&local_60);
  ON_SimpleArray<ON_Geometry_*>::~ON_SimpleArray(&local_60);
  ON_SimpleArray<ON_Geometry_*>::~ON_SimpleArray((ON_SimpleArray<ON_Geometry_*> *)local_38);
  return bVar1;
}

Assistant:

bool ON_HistoryRecord::SetGeometryValue( int value_id, ON_Geometry* g)
{
  ON_SimpleArray<ON_Geometry*> a(1);
  a.Append(g);
  return SetGeometryValues(value_id, a);
}